

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::emitHighlighted(QComboBoxPrivate *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QComboBox *_t1;
  QModelIndex *in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QString text;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _t1 = q_func(in_RDI);
  bVar2 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if (bVar2) {
    itemText((QComboBoxPrivate *)&DAT_aaaaaaaaaaaaaaaa,(QModelIndex *)&DAT_aaaaaaaaaaaaaaaa);
    QModelIndex::row(in_RSI);
    QComboBox::highlighted((QComboBox *)0x535cba,(int)((ulong)_t1 >> 0x20));
    QComboBox::textHighlighted((QComboBox *)in_RDI,(QString *)_t1);
    QString::~QString((QString *)0x535cd3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::emitHighlighted(const QModelIndex &index)
{
    Q_Q(QComboBox);
    if (!index.isValid())
        return;
    QString text(itemText(index));
    emit q->highlighted(index.row());
    emit q->textHighlighted(text);
}